

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeSignedInteger
          (ParserImpl *this,int64 *value,uint64 max_value)

{
  bool bVar1;
  bool bVar2;
  _Alloc_hider _Var3;
  uint64 unsigned_value;
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"-",&local_49);
  bVar1 = TryConsume(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  bVar2 = ConsumeUnsignedInteger(this,(uint64 *)&local_48,bVar1 + max_value);
  if (bVar2) {
    _Var3._M_p = -local_48._M_dataplus._M_p;
    if (!bVar1) {
      _Var3._M_p = local_48._M_dataplus._M_p;
    }
    *value = (int64)_Var3._M_p;
  }
  return bVar2;
}

Assistant:

bool ConsumeSignedInteger(int64* value, uint64 max_value) {
    bool negative = false;

    if (TryConsume("-")) {
      negative = true;
      // Two's complement always allows one more negative integer than
      // positive.
      ++max_value;
    }

    uint64 unsigned_value;

    DO(ConsumeUnsignedInteger(&unsigned_value, max_value));

    if (negative) {
      if ((static_cast<uint64>(kint64max) + 1) == unsigned_value) {
        *value = kint64min;
      } else {
        *value = -static_cast<int64>(unsigned_value);
      }
    } else {
      *value = static_cast<int64>(unsigned_value);
    }

    return true;
  }